

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O2

bool __thiscall TestRunner::runTests(TestRunner *this,path *dir,string *executableName)

{
  bool bVar1;
  char *extraout_RDX;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long lVar3;
  string_view text;
  uint successCount;
  uint local_d4;
  vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> tests;
  string errors;
  string line;
  path local_70;
  string testName;
  
  std::__cxx11::string::_M_assign((string *)this);
  getTestsList(&tests,this,dir);
  if (tests.super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      tests.super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
    Logger::printLine<>("No tests to run");
  }
  else {
    successCount = 0;
    lVar3 = 0;
    local_d4 = 0;
    for (pcVar2 = (pointer)0x1;
        pcVar2 + -1 <
        (pointer)((long)tests.
                        super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)tests.
                        super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5); pcVar2 = pcVar2 + 1) {
      Logger::print<>("\x1b[1;0m");
      local_70._path._M_dataplus._M_p =
           (pointer)((long)tests.
                           super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)tests.
                           super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
      testName._M_dataplus._M_p = pcVar2;
      ghc::filesystem::path::u8string_abi_cxx11_
                (&errors,(path *)((long)&((tests.
                                           super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_path).
                                         _M_dataplus._M_p + lVar3));
      tinyformat::format<unsigned_long,unsigned_long,std::__cxx11::string>
                (&line,(tinyformat *)"Test %d of %d, %s:",(char *)&testName,
                 (unsigned_long *)&local_70,(unsigned_long *)&errors,in_R9);
      std::__cxx11::string::~string((string *)&errors);
      Logger::print<std::__cxx11::string>("%-60s",&line);
      errors._M_dataplus._M_p = (pointer)&errors.field_2;
      errors._M_string_length = 0;
      errors.field_2._M_local_buf[0] = '\0';
      ghc::filesystem::path::filename
                (&local_70,
                 (path *)((long)&((tests.
                                   super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_path)._M_dataplus.
                                 _M_p + lVar3));
      ghc::filesystem::path::u8string_abi_cxx11_(&testName,&local_70);
      ghc::filesystem::path::~path(&local_70);
      bVar1 = executeTest(this,(path *)((long)&((tests.
                                                 super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->_path).
                                               _M_dataplus._M_p + lVar3),&testName,&errors);
      if (bVar1) {
        Logger::print<>("\x1b[1;32m");
        Logger::printLine<>("PASSED");
        successCount = local_d4 + 1;
        local_d4 = successCount;
      }
      else {
        Logger::print<>("\x1b[1;31m");
        Logger::printLine<>("FAILED");
        text._M_str = extraout_RDX;
        text._M_len = (size_t)errors._M_dataplus._M_p;
        Logger::printLine((Logger *)errors._M_string_length,text);
      }
      std::__cxx11::string::~string((string *)&testName);
      std::__cxx11::string::~string((string *)&errors);
      std::__cxx11::string::~string((string *)&line);
      lVar3 = lVar3 + 0x20;
    }
    Logger::print<>("\x1b[1;0m");
    line._M_dataplus._M_p =
         (pointer)((long)tests.
                         super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)tests.
                         super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
    Logger::printLine<unsigned_int,unsigned_long>
              ("\n%d out of %d tests passed.",&successCount,(unsigned_long *)&line);
    bVar1 = (long)tests.
                  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)tests.
                  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)successCount;
  }
  std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::~vector(&tests);
  return bVar1;
}

Assistant:

bool TestRunner::runTests(const fs::path& dir, const std::string& executableName)
{
	this->executableName = executableName;

	std::vector<fs::path> tests = getTestsList(dir);
	if (tests.empty())
	{
		Logger::printLine("No tests to run");
		return true;
	}

	unsigned int successCount = 0;
	for (size_t i = 0; i < tests.size(); i++)
	{
		changeConsoleColor(ConsoleColors::White);

		std::string line = tfm::format("Test %d of %d, %s:",i+1,tests.size(),tests[i].u8string());
		Logger::print("%-60s",line);

		std::string errors;

		std::string testName = tests[i].filename().u8string();
		if (!executeTest(tests[i],testName,errors))
		{
			changeConsoleColor(ConsoleColors::Red);
			Logger::printLine("FAILED");
			Logger::printLine(errors);
		} else {
			changeConsoleColor(ConsoleColors::Green);
			Logger::printLine("PASSED");
			successCount++;
		}
	}
	
	changeConsoleColor(ConsoleColors::White);
	Logger::printLine("\n%d out of %d tests passed.",successCount,tests.size());

	return successCount == tests.size();
}